

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

SockData * AGSSock::recv_extract<AGSSock::SockData>(Buffer *buffer,bool stream)

{
  string *psVar1;
  
  psVar1 = (string *)operator_new(0x20);
  *(string **)psVar1 = psVar1 + 0x10;
  *(undefined8 *)(psVar1 + 8) = 0;
  psVar1[0x10] = (string)0x0;
  (**(code **)(*AGSSockAPI::engine + 0x220))(AGSSockAPI::engine,psVar1,&agsSockData);
  std::__cxx11::string::swap(psVar1);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_front((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)buffer);
  return (SockData *)psVar1;
}

Assistant:

inline SockData *recv_extract(Buffer &buffer, bool stream)
{
	// For SockData output, we don't have to worry about zero-characters,
	// thus we receive everything and then clear the buffer.
	SockData *data = new SockData();
	AGS_OBJECT(SockData, data);
	data->data.swap(buffer.front());
	buffer.pop();
	return data;
}